

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O3

void __thiscall QFileDialogPrivate::retranslateWindowTitle(QFileDialogPrivate *this)

{
  QWidget *this_00;
  long lVar1;
  QArrayData *pQVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  byte bVar5;
  int iVar6;
  long in_FS_OFFSET;
  QStringView QVar7;
  QStringView QVar8;
  QString local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->useDefaultCaption == true) {
    this_00 = *(QWidget **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
    QWidget::windowTitle(&local_48,this_00);
    lVar1 = (this->setWindowTitle).d.size;
    bVar5 = 1;
    if (lVar1 == local_48.d.size) {
      QVar7.m_data = local_48.d.ptr;
      QVar7.m_size = lVar1;
      QVar8.m_data = (this->setWindowTitle).d.ptr;
      QVar8.m_size = lVar1;
      bVar5 = QtPrivate::equalStrings(QVar8,QVar7);
      bVar5 = bVar5 ^ 1;
    }
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (bVar5 == 0) {
      iVar6 = QFileDialogOptions::acceptMode();
      if (iVar6 == 0) {
        iVar6 = QFileDialogOptions::fileMode();
        if (iVar6 == 2) {
          iVar6 = 0x6e597a;
        }
        else {
          iVar6 = 0x6e5992;
        }
      }
      else {
        iVar6 = 0x6e5989;
      }
      QMetaObject::tr((char *)&local_48,(char *)&QFileDialog::staticMetaObject,iVar6);
      QWidget::setWindowTitle(this_00,&local_48);
      if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
        }
      }
      QWidget::windowTitle(&local_48,this_00);
      pQVar2 = &((this->setWindowTitle).d.d)->super_QArrayData;
      pcVar3 = (this->setWindowTitle).d.ptr;
      (this->setWindowTitle).d.d = local_48.d.d;
      (this->setWindowTitle).d.ptr = local_48.d.ptr;
      qVar4 = (this->setWindowTitle).d.size;
      (this->setWindowTitle).d.size = local_48.d.size;
      local_48.d.d = (Data *)pQVar2;
      local_48.d.ptr = pcVar3;
      local_48.d.size = qVar4;
      if (pQVar2 != (QArrayData *)0x0) {
        LOCK();
        (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar2,2,0x10);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFileDialogPrivate::retranslateWindowTitle()
{
    Q_Q(QFileDialog);
    if (!useDefaultCaption || setWindowTitle != q->windowTitle())
        return;
    if (q->acceptMode() == QFileDialog::AcceptOpen) {
        const QFileDialog::FileMode fileMode = q->fileMode();
        if (fileMode == QFileDialog::Directory)
            q->setWindowTitle(QFileDialog::tr("Find Directory"));
        else
            q->setWindowTitle(QFileDialog::tr("Open"));
    } else
        q->setWindowTitle(QFileDialog::tr("Save As"));

    setWindowTitle = q->windowTitle();
}